

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeInsert(BtCursor *pCur,BtreePayload *pX,int flags,int seekResult)

{
  byte bVar1;
  ushort uVar2;
  Btree *pBtree;
  Pgno parent;
  MemPage *pMVar3;
  BtreePayload *pBVar4;
  BtCursor *pCur_00;
  BtShared *pBt;
  char cVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  u8 *__dest;
  u8 *puVar9;
  uint uVar10;
  uint uVar11;
  void *pvVar12;
  int iVar13;
  uint uVar14;
  u64 v;
  uchar *pCell;
  int rc;
  int loc;
  int rc_1;
  BtreePayload x2;
  int local_c8;
  Pgno local_c4;
  uint local_c0;
  int local_bc;
  MemPage *local_b8;
  int local_ac;
  BtreePayload *local_a8;
  int local_9c;
  KeyInfo *local_98;
  BtCursor *local_90;
  u8 *local_88;
  int local_80;
  int local_7c;
  uint *local_78;
  BtShared *local_70;
  BtShared *local_68;
  BtreePayload local_60;
  
  if (pCur->eState == '\x04') {
    return pCur->skipNext;
  }
  pBtree = pCur->pBtree;
  local_70 = pBtree->pBt;
  local_bc = seekResult;
  if (((pCur->curFlags & 0x20) != 0) &&
     (local_c8 = saveAllCursors(local_70,pCur->pgnoRoot,pCur), local_c8 != 0)) {
    return local_c8;
  }
  if (pCur->pKeyInfo == (KeyInfo *)0x0) {
    invalidateIncrblobCursors(pBtree,pCur->pgnoRoot,pX->nKey,0);
    if (((pCur->curFlags & 2) == 0) || (pX->nKey != (pCur->info).nKey)) {
      if ((seekResult == 0) &&
         (local_c8 = sqlite3BtreeMovetoUnpacked
                               (pCur,(UnpackedRecord *)0x0,pX->nKey,(uint)(flags != 0),&local_bc),
         local_c8 != 0)) {
        return local_c8;
      }
    }
    else if (((pCur->info).nSize != 0) && ((pCur->info).nPayload == pX->nZero + pX->nData)) {
      iVar6 = btreeOverwriteCell(pCur,pX);
      return iVar6;
    }
  }
  else {
    if ((flags & 2U) == 0 && seekResult == 0) {
      if (pX->nMem == 0) {
        local_c8 = btreeMoveto(pCur,pX->pKey,pX->nKey,(uint)(flags != 0),&local_bc);
      }
      else {
        local_60.nKey = (sqlite3_int64)pX->aMem;
        local_60.pData._0_7_ = (uint7)pX->nMem;
        local_60.pKey = pCur->pKeyInfo;
        local_c8 = sqlite3BtreeMovetoUnpacked
                             (pCur,(UnpackedRecord *)&local_60,0,(uint)(flags != 0),&local_bc);
      }
      if (local_c8 != 0) {
        return local_c8;
      }
    }
    if (local_bc == 0) {
      getCellInfo(pCur);
      if ((pCur->info).nKey == pX->nKey) {
        local_60.pData = pX->pKey;
        local_60.nData = (int)pX->nKey;
        local_60.nZero = 0;
        iVar6 = btreeOverwriteCell(pCur,&local_60);
        return iVar6;
      }
    }
  }
  local_b8 = pCur->pPage;
  if (local_b8->nFree < 0) {
    iVar6 = btreeComputeFreeSpace(local_b8);
    if (iVar6 != 0) {
      return iVar6;
    }
    local_c8 = 0;
  }
  puVar9 = local_70->pTmpSpace;
  bVar1 = local_b8->childPtrSize;
  local_a8 = pX;
  local_90 = pCur;
  local_88 = puVar9;
  local_7c = flags;
  if (local_b8->intKey == '\0') {
    pvVar12 = pX->pKey;
    uVar8 = pX->nKey;
    if ((uint)uVar8 < 0x80) {
      puVar9[bVar1] = (u8)uVar8;
      uVar10 = 1;
    }
    else {
      uVar10 = sqlite3PutVarint(puVar9 + bVar1,(long)(int)(uint)uVar8);
      uVar10 = uVar10 & 0xff;
    }
    iVar6 = uVar10 + bVar1;
    v = uVar8 & 0xffffffff;
    puVar9 = local_88;
  }
  else {
    uVar8 = (ulong)pX->nData;
    v = (long)pX->nZero + uVar8;
    pvVar12 = pX->pData;
    if ((uint)v < 0x80) {
      puVar9[bVar1] = (u8)v;
      uVar10 = 1;
    }
    else {
      uVar10 = sqlite3PutVarint(puVar9 + bVar1,v);
      uVar10 = uVar10 & 0xff;
    }
    uVar10 = uVar10 + bVar1;
    iVar6 = sqlite3PutVarint(puVar9 + uVar10,local_a8->nKey);
    iVar6 = iVar6 + uVar10;
  }
  __dest = puVar9 + iVar6;
  iVar13 = (int)v;
  if ((int)(uint)local_b8->maxLocal < iVar13) {
    uVar2 = local_b8->minLocal;
    local_68 = local_b8->pBt;
    local_98 = (KeyInfo *)0x0;
    uVar10 = (iVar13 - (uint)uVar2) % (local_68->usableSize - 4) + (uint)uVar2;
    if ((int)(uint)local_b8->maxLocal < (int)uVar10) {
      uVar10 = (uint)uVar2;
    }
    local_c0 = iVar6 + uVar10 + 4;
    local_78 = (uint *)(puVar9 + (int)(uVar10 + iVar6));
    local_c4 = 0;
    do {
      do {
        uVar14 = (uint)v;
        uVar11 = uVar10;
        if ((int)uVar14 < (int)uVar10) {
          uVar11 = uVar14;
        }
        uVar7 = (uint)uVar8;
        if ((int)uVar7 < (int)uVar11) {
          if ((int)uVar7 < 1) {
            memset(__dest,0,(long)(int)uVar11);
          }
          else {
            memcpy(__dest,pvVar12,uVar8 & 0xffffffff);
            uVar11 = uVar7;
          }
        }
        else {
          memcpy(__dest,pvVar12,(long)(int)uVar11);
        }
        pBt = local_68;
        parent = local_c4;
        v = (u64)(uVar14 - uVar11);
        if (uVar14 - uVar11 == 0 || (int)uVar14 < (int)uVar11) {
          if (local_98 != (KeyInfo *)0x0) {
            sqlite3PagerUnrefNotNull((DbPage *)local_98[2].aColl[0]);
          }
          goto LAB_0014b241;
        }
        __dest = __dest + (int)uVar11;
        pvVar12 = (void *)((long)pvVar12 + (long)(int)uVar11);
        uVar8 = (ulong)(uVar7 - uVar11);
        uVar10 = uVar10 - uVar11;
      } while (uVar10 != 0);
      local_60.pKey = (KeyInfo *)0x0;
      if (local_68->autoVacuum != '\0') {
        do {
          uVar11 = local_c4;
          local_c4 = uVar11 + 1;
          uVar10 = 0;
          if (1 < local_c4) {
            iVar6 = (uVar11 - 1) - (uVar11 - 1) % (local_68->usableSize / 5 + 1);
            uVar10 = iVar6 + (uint)(iVar6 + 1U == (uint)sqlite3PendingByte / local_68->pageSize) + 2
            ;
          }
        } while ((local_c4 == uVar10) || (uVar11 == (uint)sqlite3PendingByte / local_68->pageSize));
        local_c4 = uVar11 + 1;
      }
      local_ac = allocateBtreePage(local_68,(MemPage **)&local_60,&local_c4,local_c4,'\0');
      if (((local_ac == 0 && pBt->autoVacuum != '\0') &&
          (ptrmapPut(pBt,local_c4,'\x04' - (parent == 0),parent,&local_ac), local_ac != 0)) &&
         ((KeyInfo *)local_60.pKey != (KeyInfo *)0x0)) {
        sqlite3PagerUnrefNotNull((DbPage *)((KeyInfo *)((long)local_60.pKey + 0x50))->aColl[0]);
      }
      iVar13 = local_ac;
      if (local_ac == 0) {
        *local_78 = local_c4 >> 0x18 | (local_c4 & 0xff0000) >> 8 | (local_c4 & 0xff00) << 8 |
                    local_c4 << 0x18;
        if (local_98 != (KeyInfo *)0x0) {
          sqlite3PagerUnrefNotNull((DbPage *)local_98[2].aColl[0]);
        }
        local_78 = *(uint **)((long)local_60.pKey + 0x50);
        *local_78 = 0;
        local_98 = (KeyInfo *)local_60.pKey;
        __dest = (u8 *)(*(long *)((long)local_60.pKey + 0x50) + 4);
        uVar10 = pBt->usableSize - 4;
        iVar6 = local_9c;
      }
      else {
        uVar10 = 0;
        iVar6 = local_ac;
        if (local_98 != (KeyInfo *)0x0) {
          local_80 = local_ac;
          sqlite3PagerUnrefNotNull((DbPage *)local_98[2].aColl[0]);
          iVar13 = local_80;
          iVar6 = local_80;
        }
      }
      local_9c = iVar6;
      iVar6 = local_9c;
    } while (iVar13 == 0);
  }
  else {
    local_c0 = 4;
    if (4 < iVar6 + iVar13) {
      local_c0 = iVar6 + iVar13;
    }
    iVar6 = (int)uVar8;
    memcpy(__dest,pvVar12,(long)iVar6);
    __dest = __dest + iVar6;
    memset(__dest,0,(long)(iVar13 - iVar6));
LAB_0014b241:
    iVar6 = 0;
  }
  pCur_00 = local_90;
  pBVar4 = local_a8;
  pMVar3 = local_b8;
  if (iVar6 != 0) {
    return iVar6;
  }
  uVar2 = local_90->ix;
  uVar10 = (uint)uVar2;
  if (local_bc != 0) {
    local_c8 = 0;
    if ((local_bc < 0) && (local_b8->nCell != 0)) {
      local_90->ix = uVar2 + 1;
      uVar10 = (uint)(ushort)(uVar2 + 1);
      local_90->curFlags = local_90->curFlags & 0xfd;
    }
    goto LAB_0014b3f1;
  }
  local_c8 = iVar6;
  local_c8 = sqlite3PagerWrite(local_b8->pDbPage);
  puVar9 = local_88;
  if (local_c8 == 0) {
    pCell = pMVar3->aData +
            (CONCAT11(pMVar3->aCellIdx[(ulong)uVar2 * 2],pMVar3->aCellIdx[(ulong)uVar2 * 2 + 1]) &
            pMVar3->maskPage);
    if (pMVar3->leaf == '\0') {
      *(undefined4 *)local_88 = *(undefined4 *)pCell;
    }
    local_c8 = clearCell(pMVar3,pCell,(CellInfo *)&local_60);
    if (local_c0 == local_60.pData._6_2_) {
      if (((uint)local_60.pData == local_60.pData._4_2_) &&
         ((local_70->autoVacuum == '\0' || ((int)local_c0 < (int)(uint)local_b8->minLocal)))) {
        if (local_b8->aDataEnd < pCell + (int)local_c0) {
          puVar9 = (u8 *)0xb;
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x118df);
          cVar5 = '\x01';
        }
        else {
          memcpy(pCell,puVar9,(long)(int)local_c0);
          cVar5 = '\x01';
          puVar9 = (u8 *)0x0;
        }
        goto LAB_0014b3da;
      }
    }
    dropCell(local_b8,(uint)uVar2,(uint)local_60.pData._6_2_,&local_c8);
    cVar5 = (local_c8 != 0) * '\x02';
  }
  else {
    cVar5 = '\x02';
    puVar9 = __dest;
  }
LAB_0014b3da:
  if (cVar5 != '\0') {
    if (cVar5 == '\x02') {
      return local_c8;
    }
    return (int)puVar9;
  }
LAB_0014b3f1:
  pMVar3 = local_b8;
  insertCell(local_b8,uVar10,local_88,local_c0,(u8 *)0x0,0,&local_c8);
  (pCur_00->info).nSize = 0;
  if (pMVar3->nOverflow != '\0') {
    pCur_00->curFlags = pCur_00->curFlags & 0xfd;
    local_c8 = balance(pCur_00);
    pCur_00->pPage->nOverflow = '\0';
    pCur_00->eState = '\x01';
    if ((local_c8 == 0 & (byte)local_7c >> 1) == 1) {
      btreeReleaseAllCursorPages(pCur_00);
      if (pCur_00->pKeyInfo != (KeyInfo *)0x0) {
        pvVar12 = sqlite3Malloc(pBVar4->nKey);
        pCur_00->pKey = pvVar12;
        if (pvVar12 == (void *)0x0) {
          local_c8 = 7;
        }
        else {
          memcpy(pvVar12,pBVar4->pKey,pBVar4->nKey);
        }
      }
      pCur_00->eState = '\x03';
      pCur_00->nKey = pBVar4->nKey;
    }
  }
  return local_c8;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeInsert(
  BtCursor *pCur,                /* Insert data into the table of this cursor */
  const BtreePayload *pX,        /* Content of the row to be inserted */
  int flags,                     /* True if this is likely an append */
  int seekResult                 /* Result of prior MovetoUnpacked() call */
){
  int rc;
  int loc = seekResult;          /* -1: before desired location  +1: after */
  int szNew = 0;
  int idx;
  MemPage *pPage;
  Btree *p = pCur->pBtree;
  BtShared *pBt = p->pBt;
  unsigned char *oldCell;
  unsigned char *newCell = 0;

  assert( (flags & (BTREE_SAVEPOSITION|BTREE_APPEND))==flags );

  if( pCur->eState==CURSOR_FAULT ){
    assert( pCur->skipNext!=SQLITE_OK );
    return pCur->skipNext;
  }

  assert( cursorOwnsBtShared(pCur) );
  assert( (pCur->curFlags & BTCF_WriteFlag)!=0
              && pBt->inTransaction==TRANS_WRITE
              && (pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );

  /* Assert that the caller has been consistent. If this cursor was opened
  ** expecting an index b-tree, then the caller should be inserting blob
  ** keys with no associated data. If the cursor was opened expecting an
  ** intkey table, the caller should be inserting integer keys with a
  ** blob of associated data.  */
  assert( (pX->pKey==0)==(pCur->pKeyInfo==0) );

  /* Save the positions of any other cursors open on this table.
  **
  ** In some cases, the call to btreeMoveto() below is a no-op. For
  ** example, when inserting data into a table with auto-generated integer
  ** keys, the VDBE layer invokes sqlite3BtreeLast() to figure out the 
  ** integer key to use. It then calls this function to actually insert the 
  ** data into the intkey B-Tree. In this case btreeMoveto() recognizes
  ** that the cursor is already where it needs to be and returns without
  ** doing any work. To avoid thwarting these optimizations, it is important
  ** not to clear the cursor here.
  */
  if( pCur->curFlags & BTCF_Multiple ){
    rc = saveAllCursors(pBt, pCur->pgnoRoot, pCur);
    if( rc ) return rc;
  }

  if( pCur->pKeyInfo==0 ){
    assert( pX->pKey==0 );
    /* If this is an insert into a table b-tree, invalidate any incrblob 
    ** cursors open on the row being replaced */
    invalidateIncrblobCursors(p, pCur->pgnoRoot, pX->nKey, 0);

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing 
    ** to a row with the same key as the new entry being inserted.
    */
#ifdef SQLITE_DEBUG
    if( flags & BTREE_SAVEPOSITION ){
      assert( pCur->curFlags & BTCF_ValidNKey );
      assert( pX->nKey==pCur->info.nKey );
      assert( pCur->info.nSize!=0 );
      assert( loc==0 );
    }
#endif

    /* On the other hand, BTREE_SAVEPOSITION==0 does not imply
    ** that the cursor is not pointing to a row to be overwritten.
    ** So do a complete check.
    */
    if( (pCur->curFlags&BTCF_ValidNKey)!=0 && pX->nKey==pCur->info.nKey ){
      /* The cursor is pointing to the entry that is to be
      ** overwritten */
      assert( pX->nData>=0 && pX->nZero>=0 );
      if( pCur->info.nSize!=0
       && pCur->info.nPayload==(u32)pX->nData+pX->nZero
      ){
        /* New entry is the same size as the old.  Do an overwrite */
        return btreeOverwriteCell(pCur, pX);
      }
      assert( loc==0 );
    }else if( loc==0 ){
      /* The cursor is *not* pointing to the cell to be overwritten, nor
      ** to an adjacent cell.  Move the cursor so that it is pointing either
      ** to the cell to be overwritten or an adjacent cell.
      */
      rc = sqlite3BtreeMovetoUnpacked(pCur, 0, pX->nKey, flags!=0, &loc);
      if( rc ) return rc;
    }
  }else{
    /* This is an index or a WITHOUT ROWID table */

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing 
    ** to a row with the same key as the new entry being inserted.
    */
    assert( (flags & BTREE_SAVEPOSITION)==0 || loc==0 );

    /* If the cursor is not already pointing either to the cell to be
    ** overwritten, or if a new cell is being inserted, if the cursor is
    ** not pointing to an immediately adjacent cell, then move the cursor
    ** so that it does.
    */
    if( loc==0 && (flags & BTREE_SAVEPOSITION)==0 ){
      if( pX->nMem ){
        UnpackedRecord r;
        r.pKeyInfo = pCur->pKeyInfo;
        r.aMem = pX->aMem;
        r.nField = pX->nMem;
        r.default_rc = 0;
        r.errCode = 0;
        r.r1 = 0;
        r.r2 = 0;
        r.eqSeen = 0;
        rc = sqlite3BtreeMovetoUnpacked(pCur, &r, 0, flags!=0, &loc);
      }else{
        rc = btreeMoveto(pCur, pX->pKey, pX->nKey, flags!=0, &loc);
      }
      if( rc ) return rc;
    }

    /* If the cursor is currently pointing to an entry to be overwritten
    ** and the new content is the same as as the old, then use the
    ** overwrite optimization.
    */
    if( loc==0 ){
      getCellInfo(pCur);
      if( pCur->info.nKey==pX->nKey ){
        BtreePayload x2;
        x2.pData = pX->pKey;
        x2.nData = pX->nKey;
        x2.nZero = 0;
        return btreeOverwriteCell(pCur, &x2);
      }
    }

  }
  assert( pCur->eState==CURSOR_VALID || (pCur->eState==CURSOR_INVALID && loc) );

  pPage = pCur->pPage;
  assert( pPage->intKey || pX->nKey>=0 );
  assert( pPage->leaf || !pPage->intKey );
  if( pPage->nFree<0 ){
    rc = btreeComputeFreeSpace(pPage);
    if( rc ) return rc;
  }

  TRACE(("INSERT: table=%d nkey=%lld ndata=%d page=%d %s\n",
          pCur->pgnoRoot, pX->nKey, pX->nData, pPage->pgno,
          loc==0 ? "overwrite" : "new entry"));
  assert( pPage->isInit );
  newCell = pBt->pTmpSpace;
  assert( newCell!=0 );
  rc = fillInCell(pPage, newCell, pX, &szNew);
  if( rc ) goto end_insert;
  assert( szNew==pPage->xCellSize(pPage, newCell) );
  assert( szNew <= MX_CELL_SIZE(pBt) );
  idx = pCur->ix;
  if( loc==0 ){
    CellInfo info;
    assert( idx<pPage->nCell );
    rc = sqlite3PagerWrite(pPage->pDbPage);
    if( rc ){
      goto end_insert;
    }
    oldCell = findCell(pPage, idx);
    if( !pPage->leaf ){
      memcpy(newCell, oldCell, 4);
    }
    rc = clearCell(pPage, oldCell, &info);
    if( info.nSize==szNew && info.nLocal==info.nPayload 
     && (!ISAUTOVACUUM || szNew<pPage->minLocal)
    ){
      /* Overwrite the old cell with the new if they are the same size.
      ** We could also try to do this if the old cell is smaller, then add
      ** the leftover space to the free list.  But experiments show that
      ** doing that is no faster then skipping this optimization and just
      ** calling dropCell() and insertCell(). 
      **
      ** This optimization cannot be used on an autovacuum database if the
      ** new entry uses overflow pages, as the insertCell() call below is
      ** necessary to add the PTRMAP_OVERFLOW1 pointer-map entry.  */
      assert( rc==SQLITE_OK ); /* clearCell never fails when nLocal==nPayload */
      if( oldCell+szNew > pPage->aDataEnd ) return SQLITE_CORRUPT_BKPT;
      memcpy(oldCell, newCell, szNew);
      return SQLITE_OK;
    }
    dropCell(pPage, idx, info.nSize, &rc);
    if( rc ) goto end_insert;
  }else if( loc<0 && pPage->nCell>0 ){
    assert( pPage->leaf );
    idx = ++pCur->ix;
    pCur->curFlags &= ~BTCF_ValidNKey;
  }else{
    assert( pPage->leaf );
  }
  insertCell(pPage, idx, newCell, szNew, 0, 0, &rc);
  assert( pPage->nOverflow==0 || rc==SQLITE_OK );
  assert( rc!=SQLITE_OK || pPage->nCell>0 || pPage->nOverflow>0 );

  /* If no error has occurred and pPage has an overflow cell, call balance() 
  ** to redistribute the cells within the tree. Since balance() may move
  ** the cursor, zero the BtCursor.info.nSize and BTCF_ValidNKey
  ** variables.
  **
  ** Previous versions of SQLite called moveToRoot() to move the cursor
  ** back to the root page as balance() used to invalidate the contents
  ** of BtCursor.apPage[] and BtCursor.aiIdx[]. Instead of doing that,
  ** set the cursor state to "invalid". This makes common insert operations
  ** slightly faster.
  **
  ** There is a subtle but important optimization here too. When inserting
  ** multiple records into an intkey b-tree using a single cursor (as can
  ** happen while processing an "INSERT INTO ... SELECT" statement), it
  ** is advantageous to leave the cursor pointing to the last entry in
  ** the b-tree if possible. If the cursor is left pointing to the last
  ** entry in the table, and the next row inserted has an integer key
  ** larger than the largest existing key, it is possible to insert the
  ** row without seeking the cursor. This can be a big performance boost.
  */
  pCur->info.nSize = 0;
  if( pPage->nOverflow ){
    assert( rc==SQLITE_OK );
    pCur->curFlags &= ~(BTCF_ValidNKey);
    rc = balance(pCur);

    /* Must make sure nOverflow is reset to zero even if the balance()
    ** fails. Internal data structure corruption will result otherwise. 
    ** Also, set the cursor state to invalid. This stops saveCursorPosition()
    ** from trying to save the current position of the cursor.  */
    pCur->pPage->nOverflow = 0;
    pCur->eState = CURSOR_INVALID;
    if( (flags & BTREE_SAVEPOSITION) && rc==SQLITE_OK ){
      btreeReleaseAllCursorPages(pCur);
      if( pCur->pKeyInfo ){
        assert( pCur->pKey==0 );
        pCur->pKey = sqlite3Malloc( pX->nKey );
        if( pCur->pKey==0 ){
          rc = SQLITE_NOMEM;
        }else{
          memcpy(pCur->pKey, pX->pKey, pX->nKey);
        }
      }
      pCur->eState = CURSOR_REQUIRESEEK;
      pCur->nKey = pX->nKey;
    }
  }
  assert( pCur->iPage<0 || pCur->pPage->nOverflow==0 );

end_insert:
  return rc;
}